

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O3

void Dar_BalancePushUniqueOrderByLevel(Vec_Ptr_t *vStore,Aig_Obj_t *pObj,int fExor)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  void **ppvVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar6 = vStore->nSize;
  uVar9 = (ulong)uVar6;
  if (0 < (int)uVar6) {
    uVar7 = 0;
    do {
      if ((Aig_Obj_t *)vStore->pArray[uVar7] == pObj) {
        if (fExor == 0) {
          return;
        }
        lVar5 = uVar9 + 1;
        do {
          if ((int)lVar5 + -1 < 1) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
          }
          lVar8 = lVar5 + -1;
          lVar3 = lVar5 + -2;
          lVar5 = lVar8;
        } while ((Aig_Obj_t *)vStore->pArray[lVar3] != pObj);
        for (; (int)lVar8 < (int)uVar6; lVar8 = lVar8 + 1) {
          vStore->pArray[lVar8 + -1] = vStore->pArray[lVar8];
        }
        vStore->nSize = uVar6 - 1;
        return;
      }
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
  }
  if (uVar6 == vStore->nCap) {
    if ((int)uVar6 < 0x10) {
      if (vStore->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vStore->pArray,0x80);
      }
      vStore->pArray = ppvVar4;
      vStore->nCap = 0x10;
    }
    else {
      if (vStore->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(uVar9 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vStore->pArray,uVar9 << 4);
      }
      vStore->pArray = ppvVar4;
      vStore->nCap = uVar6 * 2;
    }
  }
  else {
    ppvVar4 = vStore->pArray;
  }
  uVar9 = (ulong)vStore->nSize;
  uVar6 = vStore->nSize + 1;
  vStore->nSize = uVar6;
  ppvVar4[uVar9] = pObj;
  if (0 < (long)uVar9) {
    lVar5 = (ulong)uVar6 - 2;
    do {
      ppvVar4 = vStore->pArray;
      pvVar1 = ppvVar4[uVar9 & 0xffffffff];
      if ((*(uint *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x1c) & 0xffffff) <=
          (*(uint *)(((ulong)ppvVar4[lVar5] & 0xfffffffffffffffe) + 0x1c) & 0xffffff)) {
        return;
      }
      ppvVar4[uVar9 & 0xffffffff] = ppvVar4[lVar5];
      vStore->pArray[lVar5] = pvVar1;
      iVar2 = (int)uVar9;
      uVar9 = (ulong)(iVar2 - 1);
      lVar5 = lVar5 + -1;
    } while (1 < iVar2);
  }
  return;
}

Assistant:

void Dar_BalancePushUniqueOrderByLevel( Vec_Ptr_t * vStore, Aig_Obj_t * pObj, int fExor )
{
    Aig_Obj_t * pObj1, * pObj2;
    int i;
    if ( Vec_PtrPushUnique(vStore, pObj) )
    {
        if ( fExor )
            Vec_PtrRemove(vStore, pObj);
        return;
    }
    // find the p of the node
    for ( i = vStore->nSize-1; i > 0; i-- )
    {
        pObj1 = (Aig_Obj_t *)vStore->pArray[i  ];
        pObj2 = (Aig_Obj_t *)vStore->pArray[i-1];
        if ( Aig_ObjLevel(Aig_Regular(pObj1)) <= Aig_ObjLevel(Aig_Regular(pObj2)) )
            break;
        vStore->pArray[i  ] = pObj2;
        vStore->pArray[i-1] = pObj1;
    }
}